

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags,ImGuiWindowFlags extra_window_flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  short sVar4;
  ImGuiID key;
  void *pvVar5;
  ImGuiContext *g;
  ImVec2 IVar6;
  char window_name [16];
  char acStack_28 [16];
  
  pIVar3 = GImGui;
  if ((GImGui->DragDropWithinSource != false) || (GImGui->DragDropWithinTarget == true)) {
    fVar1 = (GImGui->Style).MouseCursorScale;
    IVar2 = (GImGui->IO).MousePos;
    IVar6.x = IVar2.x + fVar1 * 16.0;
    IVar6.y = IVar2.y + fVar1 * 8.0;
    (GImGui->NextWindowData).PosVal = IVar6;
    (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
    (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
    (pIVar3->NextWindowData).PosCond = 1;
    fVar1 = (pIVar3->Style).Colors[4].w;
    *(byte *)&(pIVar3->NextWindowData).Flags = (byte)(pIVar3->NextWindowData).Flags | 0x41;
    (pIVar3->NextWindowData).BgAlphaVal = fVar1 * 0.6;
    tooltip_flags = 1;
  }
  ImFormatString(acStack_28,0x10,"##Tooltip_%02d",(ulong)(uint)(int)pIVar3->TooltipOverrideCount);
  if ((tooltip_flags & 1U) != 0) {
    key = ImHashStr(acStack_28,0,0);
    pvVar5 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
    if ((pvVar5 != (void *)0x0) && (*(char *)((long)pvVar5 + 0x96) == '\x01')) {
      *(undefined1 *)((long)pvVar5 + 0x9d) = 1;
      *(undefined1 *)((long)pvVar5 + 0xb8) = 1;
      sVar4 = pIVar3->TooltipOverrideCount + 1;
      pIVar3->TooltipOverrideCount = sVar4;
      ImFormatString(acStack_28,0x10,"##Tooltip_%02d",(ulong)(uint)(int)sVar4);
    }
  }
  Begin(acStack_28,(bool *)0x0,extra_window_flags | 0x20c0347);
  return;
}

Assistant:

void ImGui::BeginTooltipEx(ImGuiTooltipFlags tooltip_flags, ImGuiWindowFlags extra_window_flags)
{
    ImGuiContext& g = *GImGui;

    if (g.DragDropWithinSource || g.DragDropWithinTarget)
    {
        // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
        // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
        // Whatever we do we want to call SetNextWindowPos() to enforce a tooltip position and disable clipping the tooltip without our display area, like regular tooltip do.
        //ImVec2 tooltip_pos = g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding;
        ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
        SetNextWindowPos(tooltip_pos);
        SetNextWindowBgAlpha(g.Style.Colors[ImGuiCol_PopupBg].w * 0.60f);
        //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This would be nice but e.g ColorButton with checkboard has issue with transparent colors :(
        tooltip_flags |= ImGuiTooltipFlags_OverridePreviousTooltip;
    }

    char window_name[16];
    ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", g.TooltipOverrideCount);
    if (tooltip_flags & ImGuiTooltipFlags_OverridePreviousTooltip)
        if (ImGuiWindow* window = FindWindowByName(window_name))
            if (window->Active)
            {
                // Hide previous tooltip from being displayed. We can't easily "reset" the content of a window so we create a new one.
                window->Hidden = true;
                window->HiddenFramesCanSkipItems = 1; // FIXME: This may not be necessary?
                ImFormatString(window_name, IM_ARRAYSIZE(window_name), "##Tooltip_%02d", ++g.TooltipOverrideCount);
            }
    ImGuiWindowFlags flags = ImGuiWindowFlags_Tooltip | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_AlwaysAutoResize;
    Begin(window_name, NULL, flags | extra_window_flags);
}